

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_singleton.c
# Opt level: O0

int log_singleton_destroy(void)

{
  int iVar1;
  log_singleton *pplVar2;
  log_singleton *s;
  log_map in_stack_ffffffffffffffe8;
  uint local_4;
  
  pplVar2 = log_singleton_instance();
  if (*pplVar2 != (log_singleton)0x0) {
    log_singleton_clear();
    iVar1 = log_map_destroy(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      (*pplVar2)->map = (log_map)0x0;
      free(*pplVar2);
      *pplVar2 = (log_singleton)0x0;
    }
    local_4 = (uint)(iVar1 != 0);
    return local_4;
  }
  abort();
}

Assistant:

int log_singleton_destroy(void)
{
	log_singleton *s = log_singleton_instance();

	if (*s == NULL)
	{
		abort();
	}

	log_singleton_clear();

	if (log_map_destroy((*s)->map) != 0)
	{
		return 1;
	}

	(*s)->map = NULL;

	free(*s);

	*s = NULL;

	return 0;
}